

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

void __thiscall CaDiCaL::Solver::Solver(Solver *this)

{
  char *pcVar1;
  FILE *pFVar2;
  Internal *this_00;
  External *this_01;
  undefined1 uVar3;
  DeferDeletePtr<CaDiCaL::External> delete_external;
  DeferDeletePtr<CaDiCaL::Internal> delete_internal;
  DeferDeletePtr<CaDiCaL::External> local_30;
  DeferDeletePtr<CaDiCaL::Internal> local_28;
  
  pcVar1 = getenv("CADICAL_API_TRACE");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("CADICALAPITRACE");
    if (pcVar1 != (char *)0x0) goto LAB_0083bcd9;
    pcVar1 = (char *)0x0;
    tracing_api_calls_through_environment_variable_method = '\0';
    this->close_trace_api_file = false;
    this->trace_api_file = (FILE *)0x0;
  }
  else {
LAB_0083bcd9:
    if (tracing_api_calls_through_environment_variable_method == '\x01') {
      fatal(
           "can not trace API calls of two solver instances using environment variable \'CADICAL_API_TRACE\'"
           );
    }
    pFVar2 = fopen(pcVar1,"w");
    this->trace_api_file = (FILE *)pFVar2;
    if (pFVar2 == (FILE *)0x0) {
      fatal("failed to open file \'%s\' to trace API calls using environment variable \'CADICAL_API_TRACE\'"
            ,pcVar1);
    }
    this->close_trace_api_file = true;
    tracing_api_calls_through_environment_variable_method = '\x01';
  }
  this->adding_clause = false;
  this->adding_constraint = false;
  this->_state = INITIALIZING;
  this_00 = (Internal *)::operator_new(0x1c78);
  Internal::Internal(this_00);
  this->internal = this_00;
  local_28.data = this_00;
  if ((FILE *)this->trace_api_file != (FILE *)0x0) {
    fprintf((FILE *)this->trace_api_file,"%s\n","init");
    fflush((FILE *)this->trace_api_file);
  }
  this_01 = (External *)::operator_new(0x238);
  External::External(this_01,this->internal);
  this->external = this_01;
  if (this->_state != CONFIGURING) {
    this->_state = CONFIGURING;
  }
  local_30.data = this_01;
  if (tracing_api_calls_through_environment_variable_method == '\x01') {
    message(this,"tracing API calls to \'%s\'",pcVar1);
  }
  pcVar1 = getenv("CADICAL_LIDRUP_TRACE");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("CADICALLIDRUPTRACE");
    if (pcVar1 == (char *)0x0) {
      uVar3 = 0;
      goto LAB_0083be20;
    }
  }
  set(this,"lidrup",1);
  set(this,"binary",0);
  uVar3 = 1;
  trace_proof(this,pcVar1);
LAB_0083be20:
  local_28.data = (Internal *)0x0;
  local_30.data = (External *)0x0;
  tracing_nb_lidrup_env_var_method = uVar3;
  DeferDeletePtr<CaDiCaL::External>::~DeferDeletePtr(&local_30);
  DeferDeletePtr<CaDiCaL::Internal>::~DeferDeletePtr(&local_28);
  return;
}

Assistant:

Solver::Solver () {

#ifndef NTRACING
  const char *path = getenv ("CADICAL_API_TRACE");
  if (!path)
    path = getenv ("CADICALAPITRACE");
  if (path) {
    if (tracing_api_calls_through_environment_variable_method)
      FATAL ("can not trace API calls of two solver instances "
             "using environment variable 'CADICAL_API_TRACE'");
    if (!(trace_api_file = fopen (path, "w")))
      FATAL ("failed to open file '%s' to trace API calls "
             "using environment variable 'CADICAL_API_TRACE'",
             path);
    close_trace_api_file = true;
    tracing_api_calls_through_environment_variable_method = true;
  } else {
    tracing_api_calls_through_environment_variable_method = false;
    close_trace_api_file = false;
    trace_api_file = 0;
  }
#endif

  adding_clause = false;
  adding_constraint = false;
  _state = INITIALIZING;
  internal = new Internal ();
  DeferDeletePtr<Internal> delete_internal (internal);
  TRACE ("init");
  external = new External (internal);
  DeferDeletePtr<External> delete_external (external);
  STATE (CONFIGURING);
#ifndef NTRACING
  if (tracing_api_calls_through_environment_variable_method)
    message ("tracing API calls to '%s'", path);
#endif

  const char *lidrup_path = getenv ("CADICAL_LIDRUP_TRACE");
  if (!lidrup_path)
    lidrup_path = getenv ("CADICALLIDRUPTRACE");
  if (lidrup_path) {

    // if (tracing_nb_lidrup_env_var_method)
    // FATAL ("can not trace LIDRUP of two solver instances "
    //   "using environment variable 'CADICAL_LIDRUP_TRACE'");
    // Here we use the solver interface to setup non-binary IDRUP tracing to
    // the defined file. Options set by the user can and will overwrite
    // these settings if neeed be.
    set ("lidrup", 1);
    set ("binary", 0);
    trace_proof (lidrup_path);
    tracing_nb_lidrup_env_var_method = true;
  } else {
    tracing_nb_lidrup_env_var_method = false;
  }

  delete_internal.release ();
  delete_external.release ();
}